

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O3

bool __thiscall buffer_queue<int>::pop(buffer_queue<int> *this,int *item)

{
  int iVar1;
  bool bVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->b_mutex;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (this->b_size < 1) {
    std::condition_variable::wait((unique_lock *)&this->b_cond);
    if (this->b_size < 1) {
      bVar2 = false;
      goto LAB_0010301a;
    }
  }
  iVar1 = (this->b_first + 1) % this->capacity;
  this->b_first = iVar1;
  *item = this->b_array[iVar1];
  this->b_size = this->b_size + -1;
  bVar2 = true;
  if (this->b_debug == true) {
    this->b_rcnt = this->b_rcnt + 1;
  }
LAB_0010301a:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar2;
}

Assistant:

bool pop(T &item)
    {

        unique_lock<mutex> lck (b_mutex);
        if (b_size <= 0)
        {           
            b_cond.wait(lck);
            if(b_size <= 0) 
            {
                return false;
            }
        }

        b_first = (b_first + 1) % capacity;
        item = b_array[b_first];
        b_size--;
        if(b_debug)
        {
            b_rcnt++;
        }

        return true;       
    }